

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDfs.c
# Opt level: O1

void Abc_AigDfs_rec(Abc_Obj_t *pNode,Vec_Ptr_t *vNodes)

{
  int iVar1;
  Abc_Ntk_t *pAVar2;
  Abc_Ntk_t *pAVar3;
  uint uVar4;
  void **ppvVar5;
  int in_EDX;
  int Fill;
  char *__assertion;
  int iVar6;
  long lVar7;
  Abc_Obj_t *pNode_00;
  
  pAVar2 = pNode->pNtk;
  iVar6 = pNode->Id;
  Vec_IntFillExtra(&pAVar2->vTravIds,iVar6 + 1,in_EDX);
  if (((long)iVar6 < 0) || ((pAVar2->vTravIds).nSize <= iVar6)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                  ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  pAVar3 = pNode->pNtk;
  iVar1 = pAVar3->nTravIds;
  if ((pAVar2->vTravIds).pArray[iVar6] == iVar1) {
    return;
  }
  iVar6 = pNode->Id;
  Vec_IntFillExtra(&pAVar3->vTravIds,iVar6 + 1,Fill);
  if (((long)iVar6 < 0) || ((pAVar3->vTravIds).nSize <= iVar6)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                  ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
  }
  (pAVar3->vTravIds).pArray[iVar6] = iVar1;
  uVar4 = *(uint *)&pNode->field_0x14 & 0xf;
  if (uVar4 == 2) {
    return;
  }
  if (uVar4 == 5) {
    return;
  }
  if (**(int **)((ulong)pNode & 0xfffffffffffffffe) != 3) {
    __assert_fail("Abc_NtkIsStrash(Abc_ObjRegular(pNode)->pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abc.h"
                  ,0x18e,"int Abc_AigNodeIsConst(Abc_Obj_t *)");
  }
  if ((*(uint *)((long)((ulong)pNode & 0xfffffffffffffffe) + 0x14) & 0xf) == 1) {
    return;
  }
  if (uVar4 != 7) {
    __assert_fail("Abc_ObjIsNode( pNode )",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcDfs.c"
                  ,0x496,"void Abc_AigDfs_rec(Abc_Obj_t *, Vec_Ptr_t *)");
  }
  if (0 < (pNode->vFanins).nSize) {
    lVar7 = 0;
    do {
      Abc_AigDfs_rec((Abc_Obj_t *)pNode->pNtk->vObjs->pArray[(pNode->vFanins).pArray[lVar7]],vNodes)
      ;
      lVar7 = lVar7 + 1;
    } while (lVar7 < (pNode->vFanins).nSize);
  }
  if (((ulong)pNode & 1) == 0) {
    if (pNode->pNtk->ntkType == ABC_NTK_STRASH) {
      if (((pNode->field_5).pData != (void *)0x0) && (0 < (pNode->vFanouts).nSize)) {
        for (pNode_00 = (Abc_Obj_t *)(pNode->field_5).pData; pNode_00 != (Abc_Obj_t *)0x0;
            pNode_00 = (Abc_Obj_t *)(pNode_00->field_5).pData) {
          Abc_AigDfs_rec(pNode_00,vNodes);
        }
      }
      uVar4 = vNodes->nCap;
      if (vNodes->nSize == uVar4) {
        if ((int)uVar4 < 0x10) {
          if (vNodes->pArray == (void **)0x0) {
            ppvVar5 = (void **)malloc(0x80);
          }
          else {
            ppvVar5 = (void **)realloc(vNodes->pArray,0x80);
          }
          vNodes->pArray = ppvVar5;
          iVar6 = 0x10;
        }
        else {
          iVar6 = uVar4 * 2;
          if (iVar6 <= (int)uVar4) goto LAB_0083dc88;
          if (vNodes->pArray == (void **)0x0) {
            ppvVar5 = (void **)malloc((ulong)uVar4 << 4);
          }
          else {
            ppvVar5 = (void **)realloc(vNodes->pArray,(ulong)uVar4 << 4);
          }
          vNodes->pArray = ppvVar5;
        }
        vNodes->nCap = iVar6;
      }
LAB_0083dc88:
      iVar6 = vNodes->nSize;
      vNodes->nSize = iVar6 + 1;
      vNodes->pArray[iVar6] = pNode;
      return;
    }
    __assertion = "Abc_NtkIsStrash(pNode->pNtk)";
  }
  else {
    __assertion = "!Abc_ObjIsComplement(pNode)";
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abc.h"
                ,400,"int Abc_AigNodeIsChoice(Abc_Obj_t *)");
}

Assistant:

void Abc_AigDfs_rec( Abc_Obj_t * pNode, Vec_Ptr_t * vNodes )
{
    Abc_Obj_t * pFanin;
    int i;
    // if this node is already visited, skip
    if ( Abc_NodeIsTravIdCurrent( pNode ) )
        return;
    // mark the node as visited
    Abc_NodeSetTravIdCurrent( pNode );
    // skip the PI
    if ( Abc_ObjIsCi(pNode) || Abc_AigNodeIsConst(pNode) )
        return;
    assert( Abc_ObjIsNode( pNode ) );
    // visit the transitive fanin of the node
    Abc_ObjForEachFanin( pNode, pFanin, i )
        Abc_AigDfs_rec( pFanin, vNodes );
    // visit the equivalent nodes
    if ( Abc_AigNodeIsChoice( pNode ) )
        for ( pFanin = (Abc_Obj_t *)pNode->pData; pFanin; pFanin = (Abc_Obj_t *)pFanin->pData )
            Abc_AigDfs_rec( pFanin, vNodes );
    // add the node after the fanins have been added
    Vec_PtrPush( vNodes, pNode );
}